

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImVector<float>::push_back(ImVector<float> *this,float *v)

{
  float *in_RSI;
  ImVector<float> *in_RDI;
  ImVector<float> *unaff_retaddr;
  ImVector<float> *pIVar1;
  
  if (in_RDI->Size == in_RDI->Capacity) {
    pIVar1 = in_RDI;
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(unaff_retaddr,(int)((ulong)pIVar1 >> 0x20));
  }
  in_RDI->Data[in_RDI->Size] = *in_RSI;
  in_RDI->Size = in_RDI->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }